

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_messages_proto2.upb.h
# Opt level: O0

bool protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_nested_message_next
               (protobuf_test_messages_proto2_TestAllTypesProto2 *msg,int32_t *key,
               protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage **val,size_t *iter)

{
  _Bool _Var1;
  undefined1 local_68 [8];
  upb_MessageValue v;
  upb_MessageValue k;
  upb_Map *map;
  upb_MiniTableField field;
  size_t *iter_local;
  protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage **val_local;
  int32_t *key_local;
  protobuf_test_messages_proto2_TestAllTypesProto2 *msg_local;
  
  stack0xffffffffffffffc4 = 0x37000000067;
  field.number_dont_copy_me__upb_internal_use_only = 0xc00b0018;
  field._4_8_ = iter;
  _upb_MiniTable_StrongReference_dont_copy_me__upb_internal_use_only
            (&
             protobuf_0test_0messages__proto2__TestAllTypesProto2__MapInt32NestedMessageEntry_msg_init
            );
  _upb_MiniTable_StrongReference_dont_copy_me__upb_internal_use_only
            (&protobuf_0test_0messages__proto2__TestAllTypesProto2__NestedMessage_msg_init);
  k.str_val.size =
       (size_t)upb_Message_GetMap(&msg->base_dont_copy_me__upb_internal_use_only,
                                  (upb_MiniTableField *)((long)&map + 4));
  if ((upb_Map *)k.str_val.size == (upb_Map *)0x0) {
    msg_local._7_1_ = false;
  }
  else {
    _Var1 = upb_Map_Next((upb_Map *)k.str_val.size,(upb_MessageValue *)&v.str_val.size,
                         (upb_MessageValue *)local_68,(size_t *)field._4_8_);
    if (_Var1) {
      *key = v.str_val.size._0_4_;
      *val = (protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *)local_68;
      msg_local._7_1_ = true;
    }
    else {
      msg_local._7_1_ = false;
    }
  }
  return msg_local._7_1_;
}

Assistant:

UPB_INLINE bool protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_nested_message_next(const protobuf_test_messages_proto2_TestAllTypesProto2* msg, int32_t* key, const protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage** val,
                           size_t* iter) {
  const upb_MiniTableField field = {103, UPB_SIZE(336, 880), 0, 24, 11, (int)kUpb_FieldMode_Map | ((int)UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte) << kUpb_FieldRep_Shift)};
  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&protobuf_0test_0messages__proto2__TestAllTypesProto2__MapInt32NestedMessageEntry_msg_init);
  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&protobuf_0test_0messages__proto2__TestAllTypesProto2__NestedMessage_msg_init);
  const upb_Map* map = upb_Message_GetMap(UPB_UPCAST(msg), &field);
  if (!map) return false;
  upb_MessageValue k;
  upb_MessageValue v;
  if (!upb_Map_Next(map, &k, &v, iter)) return false;
  memcpy(key, &k, sizeof(*key));
  memcpy(val, &v, sizeof(*val));
  return true;
}